

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O3

void __thiscall
Clasp::MinimizeBuilder::prepareLevels
          (MinimizeBuilder *this,Solver *s,SumVec *adjust,WeightVec *prios)

{
  weight_t *pwVar1;
  size_type sVar2;
  pointer puVar3;
  long lVar4;
  MLit *__seed;
  MLit *pMVar5;
  MLit *pMVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  MLit *pMVar11;
  weight_t P;
  wsum_t R;
  uint local_54;
  MinimizeBuilder *local_50;
  _Temporary_buffer<Clasp::MinimizeBuilder::MLit_*,_Clasp::MinimizeBuilder::MLit> local_48;
  
  __seed = (this->lits_).ebo_.buf;
  uVar8 = (ulong)(this->lits_).ebo_.size;
  local_50 = this;
  if (uVar8 == 0) {
    uVar7 = 0;
    (prios->ebo_).size = 0;
    (adjust->ebo_).size = 0;
    pMVar6 = __seed;
  }
  else {
    std::_Temporary_buffer<Clasp::MinimizeBuilder::MLit_*,_Clasp::MinimizeBuilder::MLit>::
    _Temporary_buffer(&local_48,__seed,uVar8 + 1 >> 1);
    if (local_48._M_buffer == (pointer)0x0) {
      std::
      __inplace_stable_sort<Clasp::MinimizeBuilder::MLit*,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::MinimizeBuilder::CmpPrio>>
                (__seed,__seed + uVar8);
    }
    else {
      std::
      __stable_sort_adaptive<Clasp::MinimizeBuilder::MLit*,Clasp::MinimizeBuilder::MLit*,long,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::MinimizeBuilder::CmpPrio>>
                (__seed,__seed + uVar8,local_48._M_buffer,local_48._M_len);
    }
    operator_delete(local_48._M_buffer);
    __seed = (local_50->lits_).ebo_.buf;
    uVar8 = (ulong)(local_50->lits_).ebo_.size;
    uVar7 = 0;
    (prios->ebo_).size = 0;
    (adjust->ebo_).size = 0;
    pMVar6 = __seed;
    if (uVar8 != 0) {
      pMVar11 = __seed + uVar8;
      do {
        local_54 = __seed->prio;
        sVar2 = (prios->ebo_).size;
        local_48._M_original_len = 0;
        puVar3 = (s->assign_).assign_.ebo_.buf;
        lVar4 = 0;
        do {
          pwVar1 = &__seed->prio;
          if (*pwVar1 != local_54) break;
          uVar7 = (__seed->lit).rep_;
          uVar8 = (ulong)__seed->weight;
          pMVar5 = __seed;
          while (((__seed = pMVar5 + 1, __seed != pMVar11 &&
                  (uVar9 = (__seed->lit).rep_ ^ uVar7, uVar9 < 4)) && (pMVar5[1].prio == *pwVar1)))
          {
            lVar10 = (long)pMVar5[1].weight;
            pMVar5 = __seed;
            if (uVar9 < 2) {
              uVar8 = uVar8 + lVar10;
            }
            else {
              uVar8 = uVar8 - lVar10;
              lVar4 = lVar4 + lVar10;
              local_48._M_original_len = lVar4;
            }
          }
          if ((long)uVar8 < 0) {
            lVar4 = lVar4 + uVar8;
            uVar7 = uVar7 & 0xfffffffe ^ 2;
            uVar8 = -uVar8;
            local_48._M_original_len = lVar4;
LAB_00151aa5:
            if ((*(byte *)((long)puVar3 + (ulong)(uVar7 & 0xfffffffc)) & 3) != 0) goto LAB_00151aba;
            if (uVar8 >> 0x1f != 0) {
              Potassco::fail(0x4b,
                             "void Clasp::MinimizeBuilder::prepareLevels(const Solver &, SumVec &, WeightVec &)"
                             ,0x290,"static_cast<weight_t>(w) == w",
                             "MinimizeBuilder: weight too large",0);
            }
            (pMVar6->lit).rep_ = uVar7;
            pMVar6->prio = sVar2;
            pMVar6->weight = (weight_t)uVar8;
            pMVar6 = pMVar6 + 1;
          }
          else {
            if (uVar8 != 0) goto LAB_00151aa5;
            uVar8 = 0;
LAB_00151aba:
            if ((byte)((byte)puVar3[uVar7 >> 2] & 3) == (byte)(2U - ((uVar7 & 2) == 0))) {
              lVar4 = lVar4 + uVar8;
              local_48._M_original_len = lVar4;
            }
          }
        } while (__seed != pMVar11);
        bk_lib::pod_vector<int,_std::allocator<int>_>::push_back(prios,(int *)&local_54);
        bk_lib::pod_vector<long,_std::allocator<long>_>::push_back(adjust,&local_48._M_original_len)
        ;
      } while (__seed != pMVar11);
      uVar7 = (local_50->lits_).ebo_.size;
      __seed = pMVar6;
      pMVar6 = (local_50->lits_).ebo_.buf;
    }
  }
  (local_50->lits_).ebo_.size =
       (int)((long)pMVar6 + ((ulong)uVar7 * 0xc - (long)__seed) >> 2) * 0x55555555 + uVar7;
  return;
}

Assistant:

void MinimizeBuilder::prepareLevels(const Solver& s, SumVec& adjust, WeightVec& prios) {
	// group first by decreasing priorities and then by variables
	std::stable_sort(lits_.begin(), lits_.end(), CmpPrio());
	prios.clear(); adjust.clear();
	// assign levels and simplify lits
	LitVec::iterator j = lits_.begin();
	for (LitVec::const_iterator it = lits_.begin(), end = lits_.end(); it != end;) {
		const weight_t P = it->prio, L = static_cast<weight_t>(prios.size());
		wsum_t R = 0;
		for (LitVec::const_iterator k; it != end && it->prio == P; it = k) {
			Literal x(it->lit); // make literal unique wrt this level
			wsum_t  w = it->weight;
			for (k = it + 1; k != end && k->lit.var() == x.var() && k->prio == P; ++k) {
				if (k->lit == x){ w += k->weight; }
				else            { w -= k->weight; R += k->weight; }
			}
			if (w < 0){
				R += w;
				x  = ~x;
				w  = -w;
			}
			if (w && s.value(x.var()) == value_free) {
				POTASSCO_CHECK(static_cast<weight_t>(w) == w, EOVERFLOW, "MinimizeBuilder: weight too large");
				*j++ = MLit(WeightLiteral(x, static_cast<weight_t>(w)), L);
			}
			else if (s.isTrue(x)) { R += w; }
		}
		prios.push_back(P);
		adjust.push_back(R);
	}
	lits_.erase(j, lits_.end());
}